

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O3

Vector3d * __thiscall
OpenMD::ForceMatrixDecomposition::getAtomToGroupVectorRow
          (Vector3d *__return_storage_ptr__,ForceMatrixDecomposition *this,int atom1,int cg1)

{
  Snapshot *this_00;
  pointer pVVar1;
  pointer pVVar2;
  long lVar3;
  Vector<double,_3U> result;
  double local_28 [4];
  
  this_00 = (this->super_ForceDecomposition).snap_;
  pVVar1 = (this_00->cgData).position.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this_00->atomData).position.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  lVar3 = 0;
  do {
    local_28[lVar3] =
         *(double *)((long)pVVar1[cg1].super_Vector<double,_3U>.data_ + lVar3 * 8) -
         *(double *)((long)(pVVar2 + atom1) + lVar3 * 8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = local_28[2];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = local_28[0];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = local_28[1];
  if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
    Snapshot::wrapVector(this_00,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d ForceMatrixDecomposition::getAtomToGroupVectorRow(int atom1,
                                                             int cg1) {
    Vector3d d;

#ifdef IS_MPI
    d = cgRowData.position[cg1] - atomRowData.position[atom1];
#else
    d = snap_->cgData.position[cg1] - snap_->atomData.position[atom1];
#endif
    if (usePeriodicBoundaryConditions_) { snap_->wrapVector(d); }
    return d;
  }